

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O0

void __thiscall ezc3d::c3d::parameter(c3d *this,string *groupName,Parameter *p)

{
  int iVar1;
  string *psVar2;
  invalid_argument *this_00;
  Parameter *in_RDX;
  size_t in_RDI;
  Parameters *unaff_retaddr;
  invalid_argument *anon_var_0;
  size_t idx;
  c3d *in_stack_00000590;
  Parameter *in_stack_ffffffffffffff48;
  Group *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  Parameters *in_stack_ffffffffffffff60;
  
  psVar2 = ParametersNS::GroupNS::Parameter::name_abi_cxx11_(in_RDX);
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Parameter must have a name");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  parameters((c3d *)0x14bd05);
  ParametersNS::Parameters::groupIdx(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  __shared_ptr_access<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x14be3c);
  ParametersNS::Parameters::group(unaff_retaddr,in_RDI);
  ParametersNS::GroupNS::Group::parameter(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  updateHeader(in_stack_00000590);
  return;
}

Assistant:

void ezc3d::c3d::parameter(const std::string &groupName,
                           const ezc3d::ParametersNS::GroupNS::Parameter &p) {
  if (!p.name().compare("")) {
    throw std::invalid_argument("Parameter must have a name");
  }

  size_t idx;
  try {
    idx = parameters().groupIdx(groupName);
  } catch (const std::invalid_argument&) {
    _parameters->group(ezc3d::ParametersNS::GroupNS::Group(groupName));
    idx = parameters().groupIdx(groupName);
  }

  _parameters->group(idx).parameter(p);

  // Do a sanity check on the header if important stuff like number
  // of frames or number of elements is changed
  updateHeader();
}